

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextdocumentlayout.cpp
# Opt level: O0

void __thiscall
QTextDocumentLayoutPrivate::drawTableCellBorder
          (QTextDocumentLayoutPrivate *this,QRectF *cellRect,QPainter *painter,QTextTable *table,
          QTextTableData *td,QTextTableCell *cell)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int *piVar16;
  const_reference this_00;
  QRectF *in_RCX;
  QTextTableData *in_RDX;
  QRectF *in_RSI;
  QTextDocumentLayoutPrivate *in_RDI;
  QTextTableCell *in_R8;
  BorderPaginator *in_R9;
  long in_FS_OFFSET;
  QRectF *borderRect;
  Edge in_stack_00000040;
  int in_stack_00000048;
  bool doNotAdjustBottomAnchor;
  bool doNotAdjustTopAnchor;
  bool suppressBottomBorder;
  bool suppressTopBorder;
  bool rowStartsOnPageBelowHeader;
  bool rowStartsOnPageTop;
  bool rowEndsOnPage;
  bool rowStartsOnPage;
  bool nextRowOnNextPage;
  bool previousRowOnPreviousPage;
  bool isLastRow;
  bool isFirstRow;
  bool isHeaderRow;
  bool tableHasHeader;
  int lastHeaderRow;
  qreal offset;
  int page;
  bool turn_off_antialiasing;
  int headerRowCount;
  qreal bottomMargin;
  qreal topMarginAfterPageBreak;
  QRectF clipped;
  BorderPaginator paginator;
  undefined4 in_stack_fffffffffffffc88;
  RenderHint in_stack_fffffffffffffc8c;
  QFixed in_stack_fffffffffffffc90;
  undefined4 in_stack_fffffffffffffc94;
  uint in_stack_fffffffffffffc98;
  undefined4 in_stack_fffffffffffffc9c;
  uint in_stack_fffffffffffffca0;
  int in_stack_fffffffffffffca4;
  uint in_stack_fffffffffffffca8;
  undefined4 in_stack_fffffffffffffcac;
  qreal in_stack_fffffffffffffcb0;
  undefined4 in_stack_fffffffffffffcb8;
  int in_stack_fffffffffffffcbc;
  QTextTableData *in_stack_fffffffffffffcc0;
  QRectF *in_stack_fffffffffffffcc8;
  QTextTableCell *in_stack_fffffffffffffcd0;
  BorderPaginator *in_stack_fffffffffffffcd8;
  undefined4 in_stack_fffffffffffffce0;
  int in_stack_fffffffffffffce4;
  QTextTableData *in_stack_fffffffffffffce8;
  byte local_2ee;
  byte local_2ed;
  byte local_2ec;
  byte local_2eb;
  byte local_2ea;
  bool local_2d2;
  QTextTableCell *pQVar17;
  undefined4 in_stack_fffffffffffffd50;
  int iVar18;
  uint in_stack_fffffffffffffd58;
  uint in_stack_fffffffffffffd60;
  uint in_stack_fffffffffffffd6c;
  uint uVar19;
  byte bVar20;
  int local_264;
  int local_1d0;
  int local_144;
  QRectF local_108;
  QFlagsStorageHelper<QPainter::RenderHint,_4> local_e8;
  QFlagsStorage<QPainter::RenderHint> local_e4;
  undefined1 local_e0 [8];
  int local_d8;
  int local_d4;
  int local_98;
  int local_94;
  int local_90;
  int local_8c;
  int local_88;
  QFixed local_84;
  int local_80;
  int local_7c;
  int local_78;
  QFixed local_74;
  QTextTableCell local_70;
  QTextTableCell local_60 [5];
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  local_7c = in_R8[7].fragment;
  local_78 = (int)QFixed::operator+((QFixed *)
                                    CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88),
                                    in_stack_fffffffffffffc90);
  local_80 = in_R8[2].fragment;
  local_74 = QFixed::operator+((QFixed *)
                               CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88),
                               in_stack_fffffffffffffc90);
  QFixed::toReal(&local_74);
  local_8c = in_R8[7].fragment;
  local_88 = (int)QFixed::operator+((QFixed *)
                                    CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88),
                                    in_stack_fffffffffffffc90);
  local_90 = in_R8[2].fragment;
  local_84 = QFixed::operator+((QFixed *)
                               CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88),
                               in_stack_fffffffffffffc90);
  QFixed::toReal(&local_84);
  QTextTable::format((QTextTable *)CONCAT44(in_stack_fffffffffffffca4,in_stack_fffffffffffffca0));
  local_94 = QTextTableFormat::headerRowCount((QTextTableFormat *)0x7fd907);
  local_98 = QTextTable::rows((QTextTable *)
                              CONCAT44(in_stack_fffffffffffffc94,in_stack_fffffffffffffc90.val));
  local_98 = local_98 + -1;
  piVar16 = qMin<int>(&local_94,&local_98);
  iVar12 = *piVar16;
  QTextTableFormat::~QTextTableFormat((QTextTableFormat *)0x7fd950);
  if ((0 < iVar12) &&
     (iVar10 = QTextTableCell::row((QTextTableCell *)
                                   CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98)),
     iVar12 <= iVar10)) {
    QFixed::toReal((QFixed *)(in_R8 + 0x14));
  }
  memcpy(local_e0,&DAT_00bd20d8,0x48);
  BorderPaginator::BorderPaginator
            (in_stack_fffffffffffffcd8,(QTextDocument *)in_stack_fffffffffffffcd0,
             in_stack_fffffffffffffcc8,(qreal)in_stack_fffffffffffffcc0,
             (qreal)CONCAT44(in_stack_fffffffffffffcbc,in_stack_fffffffffffffcb8),
             in_stack_fffffffffffffcb0);
  local_e8.super_QFlagsStorage<QPainter::RenderHint>.i =
       (QFlagsStorage<QPainter::RenderHint>)
       QPainter::renderHints
                 ((QPainter *)CONCAT44(in_stack_fffffffffffffc94,in_stack_fffffffffffffc90.val));
  local_e4.i = (Int)QFlags<QPainter::RenderHint>::operator&
                              ((QFlags<QPainter::RenderHint> *)
                               CONCAT44(in_stack_fffffffffffffc94,in_stack_fffffffffffffc90.val),
                               in_stack_fffffffffffffc8c);
  bVar8 = QFlags<QPainter::RenderHint>::operator!((QFlags<QPainter::RenderHint> *)&local_e4);
  QPainter::setRenderHint
            ((QPainter *)CONCAT44(in_stack_fffffffffffffc94,in_stack_fffffffffffffc90.val),
             in_stack_fffffffffffffc8c,SUB41((uint)in_stack_fffffffffffffc88 >> 0x18,0));
  for (local_264 = local_d8; local_264 <= local_d4; local_264 = local_264 + 1) {
    local_108.xp = -NAN;
    local_108.yp = -NAN;
    local_108.w = -NAN;
    local_108.h = -NAN;
    BorderPaginator::clipRect
              ((BorderPaginator *)CONCAT44(in_stack_fffffffffffffcac,in_stack_fffffffffffffca8),
               in_stack_fffffffffffffca4);
    bVar9 = QRectF::isValid(&local_108);
    if (bVar9) {
      borderRect = (QRectF *)QRectF::top(in_RSI);
      pQVar17 = in_R8 + 0x10;
      QTextTableCell::row((QTextTableCell *)
                          CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
      this_00 = QList<QFixed>::at((QList<QFixed> *)
                                  CONCAT44(in_stack_fffffffffffffc94,in_stack_fffffffffffffc90.val),
                                  CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
      QFixed::toReal(this_00);
      QTextTable::format((QTextTable *)CONCAT44(in_stack_fffffffffffffca4,in_stack_fffffffffffffca0)
                        );
      iVar11 = QTextTableFormat::headerRowCount((QTextTableFormat *)0x7fdb69);
      iVar11 = iVar11 + -1;
      QTextTableFormat::~QTextTableFormat((QTextTableFormat *)0x7fdb80);
      iVar18 = iVar11;
      QTextTable::format((QTextTable *)CONCAT44(in_stack_fffffffffffffca4,in_stack_fffffffffffffca0)
                        );
      iVar12 = QTextTableFormat::headerRowCount((QTextTableFormat *)0x7fdbb0);
      in_stack_fffffffffffffd58 = CONCAT13(0 < iVar12,(int3)in_stack_fffffffffffffd58);
      QTextTableFormat::~QTextTableFormat((QTextTableFormat *)0x7fdbca);
      uVar2 = in_stack_fffffffffffffd58 & 0x1000000;
      uVar3 = in_stack_fffffffffffffd58 & 0x1000000;
      uVar6 = in_stack_fffffffffffffd58 & 0x1000000;
      iVar13 = QTextTableCell::row((QTextTableCell *)
                                   CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
      QTextTable::format((QTextTable *)CONCAT44(in_stack_fffffffffffffca4,in_stack_fffffffffffffca0)
                        );
      iVar12 = QTextTableFormat::headerRowCount((QTextTableFormat *)0x7fdc10);
      in_stack_fffffffffffffd60 = CONCAT13(iVar13 < iVar12,(int3)in_stack_fffffffffffffd60);
      QTextTableFormat::~QTextTableFormat((QTextTableFormat *)0x7fdc32);
      uVar1 = in_stack_fffffffffffffd60 & 0x1000000;
      uVar4 = in_stack_fffffffffffffd60 & 0x1000000;
      uVar5 = in_stack_fffffffffffffd60 & 0x1000000;
      iVar14 = QTextTableCell::row((QTextTableCell *)
                                   CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
      iVar10 = QTextTableCell::row((QTextTableCell *)
                                   CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
      iVar12 = QTextTableCell::rowSpan
                         ((QTextTableCell *)
                          CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
      iVar12 = iVar10 + iVar12;
      iVar15 = QTextTable::rows((QTextTable *)
                                CONCAT44(in_stack_fffffffffffffc94,in_stack_fffffffffffffc90.val));
      bVar9 = iVar12 < iVar15;
      bVar7 = false;
      uVar19 = in_stack_fffffffffffffd6c & 0xffffff;
      if ((iVar14 != iVar11 + 1) && (uVar19 = in_stack_fffffffffffffd6c & 0xffffff, uVar1 == 0)) {
        adjacentCell((QTextTable *)in_stack_fffffffffffffcd8,in_stack_fffffffffffffcd0,
                     (Edge)((ulong)in_stack_fffffffffffffcc8 >> 0x20));
        bVar7 = true;
        QTextTableData::cellRect
                  (in_stack_fffffffffffffce8,
                   (QTextTableCell *)CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0));
        QRectF::translated((QRectF *)CONCAT44(in_stack_fffffffffffffca4,in_stack_fffffffffffffca0),
                           (qreal)CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98),
                           (qreal)CONCAT44(in_stack_fffffffffffffc94,in_stack_fffffffffffffc90.val))
        ;
        BorderPaginator::BorderPaginator
                  (in_stack_fffffffffffffcd8,(QTextDocument *)in_stack_fffffffffffffcd0,
                   in_stack_fffffffffffffcc8,(qreal)in_stack_fffffffffffffcc0,
                   (qreal)CONCAT44(in_stack_fffffffffffffcbc,in_stack_fffffffffffffcb8),
                   in_stack_fffffffffffffcb0);
        uVar19 = CONCAT13(local_144 < local_264,(int3)uVar19);
      }
      bVar20 = (byte)(uVar19 >> 0x18);
      if (bVar7) {
        QTextTableCell::~QTextTableCell(local_60);
      }
      if (bVar9) {
        adjacentCell((QTextTable *)in_stack_fffffffffffffcd8,in_stack_fffffffffffffcd0,
                     (Edge)((ulong)in_stack_fffffffffffffcc8 >> 0x20));
        QTextTableData::cellRect
                  (in_stack_fffffffffffffce8,
                   (QTextTableCell *)CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0));
        QRectF::translated((QRectF *)CONCAT44(in_stack_fffffffffffffca4,in_stack_fffffffffffffca0),
                           (qreal)CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98),
                           (qreal)CONCAT44(in_stack_fffffffffffffc94,in_stack_fffffffffffffc90.val))
        ;
        BorderPaginator::BorderPaginator
                  (in_stack_fffffffffffffcd8,(QTextDocument *)in_stack_fffffffffffffcd0,
                   in_stack_fffffffffffffcc8,(qreal)in_stack_fffffffffffffcc0,
                   (qreal)CONCAT44(in_stack_fffffffffffffcbc,in_stack_fffffffffffffcb8),
                   in_stack_fffffffffffffcb0);
      }
      local_2d2 = bVar9 && local_264 < local_1d0;
      if (bVar9) {
        QTextTableCell::~QTextTableCell(&local_70);
      }
      bVar9 = local_264 == local_d8;
      local_2ea = 0;
      if ((uVar2 == 0) && (local_2ea = 0, bVar9)) {
        local_2ea = bVar20;
      }
      local_2eb = 0;
      if ((uVar3 != 0) && (local_2eb = 0, bVar9)) {
        local_2eb = bVar20;
      }
      if ((in_R8[0x14].fragment & 1) == 0) {
        local_2ee = bVar9 ^ 0xff;
      }
      else {
        local_2ec = 0;
        if (uVar4 == 0) {
          local_2ed = 1;
          if (bVar9) {
            local_2ed = local_2eb;
          }
          local_2ec = local_2ed;
        }
        local_2ee = local_2ec;
      }
      if ((in_R8[0x14].fragment & 1) == 0) {
        bVar7 = local_264 != local_d4;
      }
      else {
        bVar7 = false;
        if ((uVar5 == 0) && (bVar7 = true, local_264 == local_d4)) {
          bVar7 = local_2d2;
        }
      }
      if ((in_R8[0x14].fragment & 1) == 0) {
        bVar9 = !bVar9;
      }
      else {
        bVar9 = uVar6 == 0 && !bVar9;
      }
      in_stack_fffffffffffffce4 = iVar11;
      in_stack_fffffffffffffd6c = uVar19;
      if ((local_2ee & 1) == 0) {
        drawCellBorder(in_RDI,(QPainter *)CONCAT44(uVar19,iVar12),
                       (QTextTable *)CONCAT44(iVar10,in_stack_fffffffffffffd60),
                       (QTextTableData *)CONCAT44(iVar13,in_stack_fffffffffffffd58),
                       (QTextTableCell *)CONCAT44(iVar18,in_stack_fffffffffffffd50),borderRect,
                       in_stack_00000040,in_stack_00000048,SUB81((ulong)pQVar17 >> 0x38,0),
                       SUB81((ulong)pQVar17 >> 0x30,0),SUB81((ulong)pQVar17 >> 0x28,0));
        in_stack_fffffffffffffce4 = -1;
        in_stack_fffffffffffffd6c = uVar19;
      }
      in_stack_fffffffffffffce8 = in_RDX;
      drawCellBorder(in_RDI,(QPainter *)CONCAT44(in_stack_fffffffffffffd6c,iVar12),
                     (QTextTable *)CONCAT44(iVar10,in_stack_fffffffffffffd60),
                     (QTextTableData *)CONCAT44(iVar13,in_stack_fffffffffffffd58),
                     (QTextTableCell *)CONCAT44(iVar18,in_stack_fffffffffffffd50),borderRect,
                     in_stack_00000040,in_stack_00000048,SUB81((ulong)pQVar17 >> 0x38,0),
                     SUB81((ulong)pQVar17 >> 0x30,0),SUB81((ulong)pQVar17 >> 0x28,0));
      in_stack_fffffffffffffc90.val = iVar11;
      if ((local_2ee & 1) == 0) {
        in_stack_fffffffffffffc90.val = -1;
      }
      in_stack_fffffffffffffca8 = (uint)local_2ea;
      in_stack_fffffffffffffca0 = (uint)(bVar7 ^ 1);
      in_stack_fffffffffffffc98 = (bVar9 ^ 0xff) & 1;
      in_stack_fffffffffffffc88 = 1;
      in_stack_fffffffffffffcbc = in_stack_fffffffffffffc90.val;
      in_stack_fffffffffffffcc0 = in_RDX;
      in_stack_fffffffffffffcc8 = in_RCX;
      in_stack_fffffffffffffcd0 = in_R8;
      in_stack_fffffffffffffcd8 = in_R9;
      drawCellBorder(in_RDI,(QPainter *)CONCAT44(in_stack_fffffffffffffd6c,iVar12),
                     (QTextTable *)CONCAT44(iVar10,in_stack_fffffffffffffd60),
                     (QTextTableData *)CONCAT44(iVar13,in_stack_fffffffffffffd58),
                     (QTextTableCell *)CONCAT44(iVar18,in_stack_fffffffffffffd50),borderRect,
                     in_stack_00000040,in_stack_00000048,SUB81((ulong)pQVar17 >> 0x38,0),
                     SUB81((ulong)pQVar17 >> 0x30,0),SUB81((ulong)pQVar17 >> 0x28,0));
      if (!bVar7) {
        in_stack_fffffffffffffc88 = 2;
        in_stack_fffffffffffffc90.val = -1;
        in_stack_fffffffffffffc98 = 1;
        in_stack_fffffffffffffca0 = 1;
        in_stack_fffffffffffffca8 = 0;
        drawCellBorder(in_RDI,(QPainter *)CONCAT44(in_stack_fffffffffffffd6c,iVar12),
                       (QTextTable *)CONCAT44(iVar10,in_stack_fffffffffffffd60),
                       (QTextTableData *)CONCAT44(iVar13,in_stack_fffffffffffffd58),
                       (QTextTableCell *)CONCAT44(iVar18,in_stack_fffffffffffffd50),borderRect,
                       in_stack_00000040,in_stack_00000048,SUB81((ulong)pQVar17 >> 0x38,0),
                       SUB81((ulong)pQVar17 >> 0x30,0),SUB81((ulong)pQVar17 >> 0x28,0));
      }
    }
  }
  if (bVar8) {
    QPainter::setRenderHint
              ((QPainter *)CONCAT44(in_stack_fffffffffffffc94,in_stack_fffffffffffffc90.val),
               in_stack_fffffffffffffc8c,SUB41((uint)in_stack_fffffffffffffc88 >> 0x18,0));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_10) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QTextDocumentLayoutPrivate::drawTableCellBorder(const QRectF &cellRect, QPainter *painter,
                                                     QTextTable *table, QTextTableData *td,
                                                     const QTextTableCell &cell) const
{
#ifndef QT_NO_CSSPARSER
    qreal topMarginAfterPageBreak = (td->effectiveTopMargin + td->cellSpacing + td->border).toReal();
    qreal bottomMargin = (td->effectiveBottomMargin + td->cellSpacing + td->border).toReal();

    const int headerRowCount = qMin(table->format().headerRowCount(), table->rows() - 1);
    if (headerRowCount > 0 && cell.row() >= headerRowCount)
        topMarginAfterPageBreak += td->headerHeight.toReal();

    BorderPaginator paginator(document, cellRect, topMarginAfterPageBreak, bottomMargin, 0);

    bool turn_off_antialiasing = !(painter->renderHints() & QPainter::Antialiasing);
    painter->setRenderHint(QPainter::Antialiasing);

    // paint cell borders for every page the cell appears on
    for (int page = paginator.topPage; page <= paginator.bottomPage; ++page) {
        const QRectF clipped = paginator.clipRect(page);
        if (!clipped.isValid())
            continue;

        const qreal offset = cellRect.top() - td->rowPositions.at(cell.row()).toReal();
        const int lastHeaderRow = table->format().headerRowCount() - 1;
        const bool tableHasHeader = table->format().headerRowCount() > 0;
        const bool isHeaderRow = cell.row() < table->format().headerRowCount();
        const bool isFirstRow = cell.row() == lastHeaderRow + 1;
        const bool isLastRow = cell.row() + cell.rowSpan() >= table->rows();
        const bool previousRowOnPreviousPage = !isFirstRow
                && !isHeaderRow
                && BorderPaginator(document,
                                   td->cellRect(adjacentCell(table, cell, QCss::TopEdge)).translated(0, offset),
                                   topMarginAfterPageBreak,
                                   bottomMargin,
                                   0).bottomPage < page;
        const bool nextRowOnNextPage = !isLastRow
                && BorderPaginator(document,
                                   td->cellRect(adjacentCell(table, cell, QCss::BottomEdge)).translated(0, offset),
                                   topMarginAfterPageBreak,
                                   bottomMargin,
                                   0).topPage > page;
        const bool rowStartsOnPage = page == paginator.topPage;
        const bool rowEndsOnPage = page == paginator.bottomPage;
        const bool rowStartsOnPageTop = !tableHasHeader
                && rowStartsOnPage
                && previousRowOnPreviousPage;
        const bool rowStartsOnPageBelowHeader = tableHasHeader
                && rowStartsOnPage
                && previousRowOnPreviousPage;

        const bool suppressTopBorder = td->borderCollapse
                ? !isHeaderRow && (!rowStartsOnPage || rowStartsOnPageBelowHeader)
                : !rowStartsOnPage;
        const bool suppressBottomBorder = td->borderCollapse
                ? !isHeaderRow && (!rowEndsOnPage || nextRowOnNextPage)
                : !rowEndsOnPage;
        const bool doNotAdjustTopAnchor = td->borderCollapse
                ? !tableHasHeader && !rowStartsOnPage
                : !rowStartsOnPage;
        const bool doNotAdjustBottomAnchor = suppressBottomBorder;

        if (!suppressTopBorder) {
            drawCellBorder(this, painter, table, td, cell, clipped, QCss::TopEdge,
                           -1, true, true, rowStartsOnPageTop);
        }

        drawCellBorder(this, painter, table, td, cell, clipped, QCss::LeftEdge,
                       suppressTopBorder ? lastHeaderRow : -1,
                       !doNotAdjustTopAnchor,
                       !doNotAdjustBottomAnchor,
                       rowStartsOnPageTop);
        drawCellBorder(this, painter, table, td, cell, clipped, QCss::RightEdge,
                       suppressTopBorder ? lastHeaderRow : -1,
                       !doNotAdjustTopAnchor,
                       !doNotAdjustBottomAnchor,
                       rowStartsOnPageTop);

        if (!suppressBottomBorder) {
            drawCellBorder(this, painter, table, td, cell, clipped, QCss::BottomEdge,
                           -1, true, true, false);
        }
    }

    if (turn_off_antialiasing)
        painter->setRenderHint(QPainter::Antialiasing, false);
#else
    Q_UNUSED(cell);
    Q_UNUSED(cellRect);
    Q_UNUSED(painter);
    Q_UNUSED(table);
    Q_UNUSED(td);
    Q_UNUSED(cell);
#endif
}